

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawSimpleTest.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::Draw::anon_unknown_9::SimpleDraw::iterate(TestStatus *__return_storage_ptr__,SimpleDraw *this)

{
  VkPrimitiveTopology VVar1;
  Context *this_00;
  TestLog *pTVar2;
  DeviceInterface *pDVar3;
  Image *this_01;
  TestStatus *pTVar4;
  bool bVar5;
  VkResult VVar6;
  VkQueue pVVar7;
  Allocator *allocator;
  char *__s;
  undefined8 uVar8;
  int y;
  int x;
  double dVar9;
  double dVar10;
  allocator<char> local_169;
  undefined8 local_168;
  undefined4 local_160;
  TestStatus *local_158;
  TestLog *local_150;
  VkQueue local_148;
  double local_140;
  double local_138;
  double local_130;
  long *local_128;
  long local_120;
  long local_118 [2];
  ConstPixelBufferAccess renderedFrame;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  Texture2D referenceFrame;
  VkSubmitInfo submitInfo;
  
  this_00 = (this->super_DrawTestsBaseClass).super_TestInstance.m_context;
  pTVar2 = this_00->m_testCtx->m_log;
  pVVar7 = Context::getUniversalQueue(this_00);
  DrawTestsBaseClass::beginRenderPass(&this->super_DrawTestsBaseClass);
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x58])
            (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x4c])
            (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DrawTestsBaseClass).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  VVar1 = (this->super_DrawTestsBaseClass).m_topology;
  if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
    uVar8 = 6;
  }
  else {
    if (VVar1 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) goto LAB_006cdb3b;
    uVar8 = 4;
  }
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x59])
            (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,uVar8,1,2,0);
LAB_006cdb3b:
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x76])
            (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  (*pDVar3->_vptr_DeviceInterface[0x4a])
            (pDVar3,(this->super_DrawTestsBaseClass).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  VVar6 = (*pDVar3->_vptr_DeviceInterface[2])(pDVar3,pVVar7,1);
  ::vk::checkResult(VVar6,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawSimpleTest.cpp"
                    ,0xa2);
  pDVar3 = (this->super_DrawTestsBaseClass).m_vk;
  VVar6 = (*pDVar3->_vptr_DeviceInterface[3])(pDVar3,pVVar7);
  ::vk::checkResult(VVar6,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawSimpleTest.cpp"
                    ,0xa4);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DrawTestsBaseClass).m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x100,0x100);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  local_158 = __return_storage_ptr__;
  local_150 = pTVar2;
  local_148 = pVVar7;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  if (0 < referenceFrame.m_height) {
    local_140 = (double)referenceFrame.m_height * 0.5;
    dVar9 = (double)referenceFrame.m_width * 0.5;
    y = 0;
    local_138 = dVar9;
    do {
      if (0 < referenceFrame.m_width) {
        dVar10 = (double)ABS((float)((double)y / local_140) + -1.0);
        x = 0;
        local_130 = dVar10;
        do {
          if ((dVar10 <= 0.3) && (ABS((float)((double)x / dVar9) + -1.0) <= 0.3)) {
            renderedFrame.m_format.order = R;
            renderedFrame.m_format.type = SNORM_INT8;
            renderedFrame.m_size.m_data[0] = 0x3f800000;
            renderedFrame.m_size.m_data[1] = 0x3f800000;
            tcu::PixelBufferAccess::setPixel
                      (referenceFrame.super_TextureLevelPyramid.m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x,y,0);
            dVar9 = local_138;
            dVar10 = local_130;
          }
          x = x + 1;
        } while (referenceFrame.m_width != x);
      }
      y = y + 1;
    } while (y != referenceFrame.m_height);
  }
  this_01 = (this->super_DrawTestsBaseClass).m_colorTargetImage.m_ptr;
  allocator = Context::getDefaultAllocator
                        ((this->super_DrawTestsBaseClass).super_TestInstance.m_context);
  local_160 = 0;
  local_168 = 0;
  Image::readSurface(&renderedFrame,this_01,local_148,allocator,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar5 = tcu::fuzzyCompare(local_150,"Result","Image comparison result",
                            &(referenceFrame.super_TextureLevelPyramid.m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  __s = qpGetTestResultName((uint)!bVar5);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,__s,&local_169);
  pTVar4 = local_158;
  local_158->m_code = (uint)!bVar5;
  (local_158->m_description)._M_dataplus._M_p = (pointer)&(local_158->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158->m_description,local_128,local_120 + (long)local_128);
  if (local_128 != local_118) {
    operator_delete(local_128,local_118[0] + 1);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar4;
}

Assistant:

tcu::TestStatus SimpleDraw::iterate (void)
{
	tcu::TestLog &log							= m_context.getTestContext().getLog();
	const vk::VkQueue queue						= m_context.getUniversalQueue();

	beginRenderPass();

	const vk::VkDeviceSize vertexBufferOffset	= 0;
	const vk::VkBuffer vertexBuffer				= m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	switch (m_topology)
	{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			m_vk.cmdDraw(*m_cmdBuffer, 6, 1, 2, 0);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			m_vk.cmdDraw(*m_cmdBuffer, 4, 1, 2, 0);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LAST:
			DE_FATAL("Topology not implemented");
			break;
		default:
			DE_FATAL("Unknown topology");
			break;
	}

	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));

	referenceFrame.allocLevel(0);

	const deInt32 frameWidth	= referenceFrame.getWidth();
	const deInt32 frameHeight	= referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageCoordinates refCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refCoords.bottom	&&
				 yCoord <= refCoords.top	&&
				 xCoord >= refCoords.left	&&
				 xCoord <= refCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));

}